

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::ExeName::parse(ExeName *this,string *param_2,TokenStream *tokens)

{
  InternalParseResult *in_RDI;
  
  ParseState::ParseState
            ((ParseState *)in_RDI,(ParseResultType)((ulong)in_RDI >> 0x20),(TokenStream *)0x283d6d);
  BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
            ((ParseState *)in_RDI);
  ParseState::~ParseState((ParseState *)0x283d88);
  return in_RDI;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
        }